

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_transform_size_8x8_flag(bitstream *str,h264_cabac_context *cabac,uint32_t *binVal)

{
  h264_macroblock *phVar1;
  h264_cabac_context *in_RDX;
  h264_slice *in_RSI;
  int condTermFlagB;
  int condTermFlagA;
  int ctxIdxInc;
  int ctxIdxOffset;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint32_t uVar2;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int ctxIdx;
  int local_4;
  
  if (in_RSI == (h264_slice *)0x0) {
    local_4 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
  }
  else {
    ctxIdx = 399;
    phVar1 = h264_mb_nb(in_RSI,(h264_mb_pos)((ulong)in_RDX >> 0x20),(int)in_RDX);
    uVar2 = phVar1->transform_size_8x8_flag;
    phVar1 = h264_mb_nb(in_RSI,(h264_mb_pos)((ulong)in_RDX >> 0x20),(int)in_RDX);
    local_4 = h264_cabac_decision((bitstream *)in_RSI,in_RDX,ctxIdx,
                                  (uint32_t *)CONCAT44(uVar2,phVar1->transform_size_8x8_flag));
  }
  return local_4;
}

Assistant:

int h264_transform_size_8x8_flag(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *binVal) {
	if (!cabac)
		return vs_u(str, binVal, 1);
	int ctxIdxOffset = H264_CABAC_CTXIDX_TRANSFORM_SIZE_8X8_FLAG, ctxIdxInc;
	int condTermFlagA = h264_mb_nb(cabac->slice, H264_MB_A, 0)->transform_size_8x8_flag;
	int condTermFlagB = h264_mb_nb(cabac->slice, H264_MB_B, 0)->transform_size_8x8_flag;
	ctxIdxInc = condTermFlagA + condTermFlagB;
	return h264_cabac_decision(str, cabac, ctxIdxOffset+ctxIdxInc, binVal);
}